

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

void opj_read_bytes_LE(OPJ_BYTE *p_buffer,OPJ_UINT32 *p_value,OPJ_UINT32 p_nb_bytes)

{
  long lVar1;
  long lVar2;
  
  *p_value = 0;
  if (p_nb_bytes != 0) {
    lVar2 = (long)p_value + -1;
    lVar1 = 0;
    do {
      *(OPJ_BYTE *)(lVar2 + (ulong)p_nb_bytes) = p_buffer[lVar1];
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (p_nb_bytes != (OPJ_UINT32)lVar1);
  }
  return;
}

Assistant:

void opj_read_bytes_LE(const OPJ_BYTE * p_buffer, OPJ_UINT32 * p_value, OPJ_UINT32 p_nb_bytes)
{
	OPJ_BYTE * l_data_ptr = ((OPJ_BYTE *) p_value) + p_nb_bytes-1;
	OPJ_UINT32 i;

	assert(p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32));

	*p_value = 0;
	for (i=0;i<p_nb_bytes;++i) {
		*(l_data_ptr--) = *(p_buffer++);
	}
}